

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string1.cpp
# Opt level: O2

void __thiscall String::String(String *this,String *other)

{
  ostream *poVar1;
  size_t sVar2;
  char *__dest;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"String copy constuctor!");
  std::endl<char,std::char_traits<char>>(poVar1);
  sVar2 = strlen(other->m_data);
  __dest = (char *)operator_new__(sVar2 + 1);
  this->m_data = __dest;
  strcpy(__dest,other->m_data);
  this->m_size = sVar2;
  return;
}

Assistant:

String::String(const String& other)
{
	cout << "String copy constuctor!" << endl;
	size_t len = strlen(other.m_data);
	m_data = new char[len + 1];
	strcpy(m_data, other.m_data);
	m_size = len;
}